

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

void ktxMemStream_setup(ktxStream *str)

{
  ktxStream *str_local;
  
  str->type = eStreamTypeMemory;
  str->read = ktxMemStream_read;
  str->skip = ktxMemStream_skip;
  str->write = ktxMemStream_write;
  str->getpos = ktxMemStream_getpos;
  str->setpos = ktxMemStream_setpos;
  str->getsize = ktxMemStream_getsize;
  str->destruct = ktxMemStream_destruct;
  return;
}

Assistant:

void
ktxMemStream_setup(ktxStream* str)
{
    str->type = eStreamTypeMemory;
    str->read = ktxMemStream_read;
    str->skip = ktxMemStream_skip;
    str->write = ktxMemStream_write;
    str->getpos = ktxMemStream_getpos;
    str->setpos = ktxMemStream_setpos;
    str->getsize = ktxMemStream_getsize;
    str->destruct = ktxMemStream_destruct;
}